

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

char * sx_replacechar(char *dest,int dest_sz,char *src,char find,char replace)

{
  int offset;
  int dest_max;
  char replace_local;
  char find_local;
  char *src_local;
  int dest_sz_local;
  char *dest_local;
  
  for (_dest_max = src; *_dest_max != '\0' && 0 < dest_sz + -1; _dest_max = _dest_max + 1) {
    if (*_dest_max == find) {
      *dest = replace;
    }
    else {
      *dest = *_dest_max;
    }
  }
  *dest = '\0';
  return dest;
}

Assistant:

char* sx_replacechar(char* dest, int dest_sz, const char* src, const char find, const char replace)
{
    int dest_max = dest_sz - 1;
    int offset = 0;
    while (*src && offset < dest_max) {
        if (*src != find)
            dest[offset] = *src;
        else
            dest[offset] = replace;
        ++src;
    }
    dest[offset] = '\0';
    return dest;
}